

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDASensTestError(IDAMem IDA_mem,sunrealtype ck,sunrealtype *err_k,sunrealtype *err_km1,
                    sunrealtype *err_km2)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  sunrealtype sVar5;
  double dVar6;
  sunrealtype sVar7;
  double dVar8;
  double dVar9;
  int retval;
  int check_for_reduction;
  N_Vector *tempv;
  sunrealtype terr_km2;
  sunrealtype terr_km1;
  sunrealtype terr_k;
  sunrealtype errS_km2;
  sunrealtype errS_km1;
  sunrealtype errS_k;
  sunrealtype enormS;
  int in_stack_ffffffffffffff6c;
  N_Vector *in_stack_ffffffffffffff70;
  N_Vector *in_stack_ffffffffffffff78;
  N_Vector *xS;
  IDAMem in_stack_ffffffffffffff80;
  IDAMem IDA_mem_00;
  int local_4;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x3b0);
  sVar5 = IDASensWrmsNorm(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  dVar6 = *(double *)(in_RDI + 0x218 + (long)*(int *)(in_RDI + 0x4b8) * 8) * sVar5;
  bVar2 = *in_RSI <= dVar6 && dVar6 != *in_RSI;
  if (bVar2) {
    *in_RSI = dVar6;
  }
  dVar6 = (double)(*(int *)(in_RDI + 0x4b8) + 1) * *in_RSI;
  if (1 < *(int *)(in_RDI + 0x4b8)) {
    iVar4 = N_VLinearSumVectorArray
                      (0x3ff0000000000000,*(undefined4 *)(in_RDI + 0xa0),
                       *(undefined8 *)(in_RDI + 0x350 + (long)*(int *)(in_RDI + 0x4b8) * 8),
                       *(undefined8 *)(in_RDI + 0x388),uVar1);
    if (iVar4 != 0) {
      return -0x1c;
    }
    IDA_mem_00 = *(IDAMem *)(in_RDI + 0x218 + (long)(*(int *)(in_RDI + 0x4b8) + -1) * 8);
    sVar7 = IDASensWrmsNorm(IDA_mem_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff6c);
    dVar8 = (double)IDA_mem_00 * sVar7;
    bVar3 = *in_RDX <= dVar8 && dVar8 != *in_RDX;
    if (bVar3) {
      *in_RDX = dVar8;
    }
    dVar8 = (double)*(int *)(in_RDI + 0x4b8) * *in_RDX;
    if (*(int *)(in_RDI + 0x4c0) == *(int *)(in_RDI + 0x4b8) && (bVar3 || bVar2)) {
      if (*(int *)(in_RDI + 0x4b8) < 3) {
        if (dVar8 <= dVar6 * 0.5) {
          *(int *)(in_RDI + 0x4c0) = *(int *)(in_RDI + 0x4b8) + -1;
        }
      }
      else {
        iVar4 = N_VLinearSumVectorArray
                          (0x3ff0000000000000,*(undefined4 *)(in_RDI + 0xa0),
                           *(undefined8 *)
                            (in_RDI + 0x350 + (long)(*(int *)(in_RDI + 0x4b8) + -1) * 8),uVar1,uVar1
                          );
        if (iVar4 != 0) {
          return -0x1c;
        }
        xS = *(N_Vector **)(in_RDI + 0x218 + (long)(*(int *)(in_RDI + 0x4b8) + -2) * 8);
        sVar7 = IDASensWrmsNorm(IDA_mem_00,xS,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        dVar9 = (double)xS * sVar7;
        if (*in_RCX <= dVar9 && dVar9 != *in_RCX) {
          *in_RCX = dVar9;
        }
        dVar9 = (double)(*(int *)(in_RDI + 0x4b8) + -1) * *in_RCX;
        if (dVar9 < dVar8) {
          dVar9 = dVar8;
        }
        if (dVar9 <= dVar6) {
          *(int *)(in_RDI + 0x4c0) = *(int *)(in_RDI + 0x4b8) + -1;
        }
      }
    }
  }
  if (in_XMM0_Qa * sVar5 <= 1.0) {
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

static int IDASensTestError(IDAMem IDA_mem, sunrealtype ck, sunrealtype* err_k,
                            sunrealtype* err_km1, sunrealtype* err_km2)
{
  sunrealtype enormS;
  sunrealtype errS_k, errS_km1, errS_km2;
  sunrealtype terr_k, terr_km1, terr_km2;
  N_Vector* tempv;
  sunbooleantype check_for_reduction = SUNFALSE;
  int retval;

  /* Rename deltaS */
  tempv = IDA_mem->ida_deltaS;

  /* Update error for order k. */
  enormS = IDASensWrmsNorm(IDA_mem, IDA_mem->ida_eeS, IDA_mem->ida_ewtS,
                           IDA_mem->ida_suppressalg);
  errS_k = IDA_mem->ida_sigma[IDA_mem->ida_kk] * enormS;
  if (errS_k > *err_k)
  {
    *err_k              = errS_k;
    check_for_reduction = SUNTRUE;
  }
  terr_k = (IDA_mem->ida_kk + 1) * (*err_k);

  if (IDA_mem->ida_kk > 1)
  {
    /* Update error at order k-1 */
    retval = N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE,
                                     IDA_mem->ida_phiS[IDA_mem->ida_kk], ONE,
                                     IDA_mem->ida_eeS, tempv);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

    errS_km1 = IDA_mem->ida_sigma[IDA_mem->ida_kk - 1] *
               IDASensWrmsNorm(IDA_mem, tempv, IDA_mem->ida_ewtS,
                               IDA_mem->ida_suppressalg);

    if (errS_km1 > *err_km1)
    {
      *err_km1            = errS_km1;
      check_for_reduction = SUNTRUE;
    }
    terr_km1 = IDA_mem->ida_kk * (*err_km1);

    /* Has an order decrease already been decided in IDATestError? */
    if (IDA_mem->ida_knew != IDA_mem->ida_kk)
    {
      check_for_reduction = SUNFALSE;
    }

    if (check_for_reduction)
    {
      if (IDA_mem->ida_kk > 2)
      {
        /* Update error at order k-2 */
        retval = N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE,
                                         IDA_mem->ida_phiS[IDA_mem->ida_kk - 1],
                                         ONE, tempv, tempv);
        if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

        errS_km2 = IDA_mem->ida_sigma[IDA_mem->ida_kk - 2] *
                   IDASensWrmsNorm(IDA_mem, tempv, IDA_mem->ida_ewtS,
                                   IDA_mem->ida_suppressalg);

        if (errS_km2 > *err_km2) { *err_km2 = errS_km2; }
        terr_km2 = (IDA_mem->ida_kk - 1) * (*err_km2);

        /* Decrease order if errors are reduced */
        if (SUNMAX(terr_km1, terr_km2) <= terr_k)
        {
          IDA_mem->ida_knew = IDA_mem->ida_kk - 1;
        }
      }
      else
      {
        /* Decrease order to 1 if errors are reduced by at least 1/2 */
        if (terr_km1 <= (HALF * terr_k))
        {
          IDA_mem->ida_knew = IDA_mem->ida_kk - 1;
        }
      }
    }
  }

  /* Perform error test */
  if (ck * enormS > ONE) { return (ERROR_TEST_FAIL); }
  else { return (IDA_SUCCESS); }
}